

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O3

uint64_t __thiscall protozero::pbf_reader::get_fixed64(pbf_reader *this)

{
  uint64_t *puVar1;
  assert_error *this_00;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"")
    ;
  }
  else {
    if (this->m_wire_type == fixed64) {
      puVar1 = (uint64_t *)this->m_data;
      skip_bytes(this,8);
      return *puVar1;
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,"has_wire_type(pbf_wire_type::fixed64) && \"not a 64-bit fixed\"");
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t get_fixed64() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::fixed64) && "not a 64-bit fixed");
        return get_fixed<uint64_t>();
    }